

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O2

REF_STATUS ref_recon_rsn(REF_GRID ref_grid,REF_INT node,REF_DBL *r,REF_DBL *s,REF_DBL *n)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_ADJ pRVar2;
  REF_DBL *pRVar3;
  REF_ADJ_ITEM pRVar4;
  uint uVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  ulong uVar9;
  REF_INT cell;
  char *pcVar10;
  long lVar11;
  double dVar12;
  double local_e0;
  REF_DBL dr [3];
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  *r = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;
  uVar5 = ref_recon_normal(ref_grid,node,n);
  if (uVar5 == 0) {
    uVar9 = 0xffffffff;
    cell = -1;
    if (-1 < node) {
      pRVar2 = ref_cell->ref_adj;
      uVar9 = 0xffffffff;
      cell = -1;
      if (node < pRVar2->nnode) {
        uVar5 = pRVar2->first[(uint)node];
        uVar9 = 0xffffffff;
        cell = -1;
        if ((long)(int)uVar5 != -1) {
          cell = pRVar2->item[(int)uVar5].ref;
          uVar9 = (ulong)uVar5;
        }
      }
    }
    lVar11 = (long)(node * 0xf);
    local_e0 = 2.0;
    while ((int)uVar9 != -1) {
      uVar5 = ref_cell_nodes(ref_cell,cell,nodes);
      if (uVar5 != 0) {
        pcVar10 = "cell nodes";
        uVar7 = 0x5de;
        goto LAB_001df4f6;
      }
      for (lVar8 = 0; lVar8 < ref_cell->node_per; lVar8 = lVar8 + 1) {
        lVar6 = (long)nodes[lVar8];
        if (nodes[lVar8] != node) {
          pRVar3 = pRVar1->real;
          dr[0] = pRVar3[lVar6 * 0xf] - pRVar3[lVar11];
          dr[1] = pRVar3[lVar6 * 0xf + 1] - pRVar3[lVar11 + 1];
          dr[2] = pRVar3[lVar6 * 0xf + 2] - pRVar3[lVar11 + 2];
          uVar5 = ref_math_normalize(dr);
          if (uVar5 != 0) {
            pcVar10 = "norm dr";
            uVar7 = 0x5e7;
            goto LAB_001df4f6;
          }
          dVar12 = n[2] * dr[2] + *n * dr[0] + dr[1] * n[1];
          if (dVar12 <= -dVar12) {
            dVar12 = -dVar12;
          }
          if (dVar12 < local_e0) {
            *r = dr[0];
            r[1] = dr[1];
            r[2] = dr[2];
            local_e0 = dVar12;
          }
        }
      }
      pRVar4 = ref_cell->ref_adj->item;
      uVar9 = (ulong)pRVar4[(int)uVar9].next;
      cell = -1;
      if (uVar9 != 0xffffffffffffffff) {
        cell = pRVar4[uVar9].ref;
      }
    }
    dVar12 = n[2] * r[2] + *r * *n + n[1] * r[1];
    *r = *r - *n * dVar12;
    r[1] = r[1] - n[1] * dVar12;
    r[2] = r[2] - dVar12 * n[2];
    uVar5 = ref_math_normalize(r);
    if (uVar5 == 0) {
      *s = n[1] * r[2] - r[1] * n[2];
      s[1] = n[2] * *r - r[2] * *n;
      s[2] = *n * r[1] - *r * n[1];
      return 0;
    }
    pcVar10 = "norm r";
    uVar7 = 0x5f7;
  }
  else {
    pcVar10 = "norm";
    uVar7 = 0x5dc;
  }
LAB_001df4f6:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar7,
         "ref_recon_rsn",(ulong)uVar5,pcVar10);
  return uVar5;
}

Assistant:

REF_FCN REF_STATUS ref_recon_rsn(REF_GRID ref_grid, REF_INT node, REF_DBL *r,
                                 REF_DBL *s, REF_DBL *n) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, nodes[REF_CELL_MAX_SIZE_PER], cell_node;
  REF_DBL small_dot, dot;
  REF_DBL dr[3];

  r[0] = 0.0;
  r[1] = 0.0;
  r[2] = 0.0;

  small_dot = 2.0;
  RSS(ref_recon_normal(ref_grid, node, n), "norm");
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "cell nodes");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      if (node != nodes[cell_node]) {
        dr[0] = ref_node_xyz(ref_node, 0, nodes[cell_node]) -
                ref_node_xyz(ref_node, 0, node);
        dr[1] = ref_node_xyz(ref_node, 1, nodes[cell_node]) -
                ref_node_xyz(ref_node, 1, node);
        dr[2] = ref_node_xyz(ref_node, 2, nodes[cell_node]) -
                ref_node_xyz(ref_node, 2, node);
        RSS(ref_math_normalize(dr), "norm dr");
        dot = ABS(ref_math_dot(dr, n));
        if (dot < small_dot) {
          small_dot = dot;
          r[0] = dr[0];
          r[1] = dr[1];
          r[2] = dr[2];
        }
      }
    }
  }

  dot = ref_math_dot(r, n);
  r[0] -= dot * n[0];
  r[1] -= dot * n[1];
  r[2] -= dot * n[2];
  RSS(ref_math_normalize(r), "norm r");

  ref_math_cross_product(n, r, s);

  return REF_SUCCESS;
}